

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall Gecko::Graph::vcycle(Graph *this,uint n,uint work)

{
  float fVar1;
  pointer puVar2;
  pointer pNVar3;
  pointer pfVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  Graph *this_00;
  uint n_00;
  long lVar9;
  float fVar10;
  
  uVar5 = (int)((ulong)((long)(this->node).
                              super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->node).
                             super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 4) - 1;
  if (((n < uVar5) &&
      (uVar5 < (uint)(((ulong)((long)(this->adj).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->adj).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff >>
                     1))) && (this->level != 0)) {
    iVar6 = (*this->progress->_vptr_Progress[8])();
    if ((char)iVar6 == '\0') {
      this_00 = coarsen(this);
      vcycle(this_00,n,
             (int)(((ulong)((long)(this->adj).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->adj).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff >> 1)
             + work);
      refine(this,this_00);
      pfVar4 = (this_00->bond).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pfVar4 != (pointer)0x0) {
        operator_delete(pfVar4);
      }
      pfVar4 = (this_00->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pfVar4 != (pointer)0x0) {
        operator_delete(pfVar4);
      }
      puVar2 = (this_00->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      pNVar3 = (this_00->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (pNVar3 != (pointer)0x0) {
        operator_delete(pNVar3);
      }
      puVar2 = (this_00->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      operator_delete(this_00);
      goto LAB_00109362;
    }
  }
  puVar2 = (this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = (int)((ulong)((long)(this->perm).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2);
  if (iVar6 != 0) {
    pNVar3 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar10 = 0.0;
    lVar9 = 0;
    do {
      uVar5 = puVar2[lVar9];
      fVar1 = pNVar3[uVar5].hlen;
      fVar10 = fVar10 + fVar1;
      pNVar3[uVar5].pos = fVar10;
      fVar10 = fVar10 + fVar1;
      lVar9 = lVar9 + 1;
    } while (iVar6 != (int)lVar9);
  }
LAB_00109362:
  if ((((ulong)((long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff & 0x1fffffffe) !=
      0) {
    relax(this,true,1);
    relax(this,false,1);
    uVar8 = ((ulong)((long)(this->adj).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->adj).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff >> 1;
    uVar5 = n - 1;
    do {
      uVar7 = (int)uVar8 * (uVar5 + 2);
      uVar8 = (ulong)uVar7;
      uVar5 = uVar5 + 1;
    } while (uVar7 < work);
    if (uVar5 != 0) {
      n_00 = 0x10;
      if (uVar5 < 0x10) {
        n_00 = uVar5;
      }
      optimize(this,n_00);
      return;
    }
  }
  return;
}

Assistant:

void
Graph::vcycle(uint n, uint work)
{
  if (n < nodes() && nodes() < edges() && level && !progress->quit()) {
    Graph* graph = coarsen();
    graph->vcycle(n, work + edges());
    refine(graph);
    delete graph;
  }
  else
    place();
  if (edges()) {
    relax(true, GECKO_CR_SWEEPS);
    relax(false, GECKO_GS_SWEEPS);
    for (uint w = edges(); w * (n + 1) < work; w *= ++n);
    n = std::min(n, uint(GECKO_WINDOW_MAX));
    if (n)
      optimize(n);
  }
}